

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O2

void absl::CopyCordToString(Cord *src,Nonnull<std::string_*> dst)

{
  if (((src->contents_).data_.rep_.field_0.data[0] & 1U) == 0) {
    Cord::InlineRep::CopyTo(&src->contents_,dst);
    return;
  }
  Cord::InlineRep::size(&src->contents_);
  std::__cxx11::string::resize((ulong)dst);
  Cord::CopyToArraySlowPath(src,(dst->_M_dataplus)._M_p);
  return;
}

Assistant:

void CopyCordToString(const Cord& src, absl::Nonnull<std::string*> dst) {
  if (!src.contents_.is_tree()) {
    src.contents_.CopyTo(dst);
  } else {
    absl::strings_internal::STLStringResizeUninitialized(dst, src.size());
    src.CopyToArraySlowPath(&(*dst)[0]);
  }
}